

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PciTopology.h
# Opt level: O3

String __thiscall xmrig::PciTopology::toString(PciTopology *this)

{
  char *__s;
  size_t sVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  char *in_RSI;
  String SVar3;
  
  if (*in_RSI == '\0') {
    String::String((String *)this,"n/a");
    sVar2 = extraout_RDX_00;
  }
  else {
    __s = (char *)operator_new__(8);
    __s[0] = '\0';
    __s[1] = '\0';
    __s[2] = '\0';
    __s[3] = '\0';
    __s[4] = '\0';
    __s[5] = '\0';
    __s[6] = '\0';
    __s[7] = '\0';
    snprintf(__s,8,"%02hhx:%02hhx.%01hhx",(ulong)(byte)in_RSI[1],(ulong)(byte)in_RSI[2],
             (ulong)(byte)in_RSI[3]);
    *(char **)this = __s;
    sVar1 = strlen(__s);
    *(size_t *)(this + 2) = sVar1;
    sVar2 = extraout_RDX;
  }
  SVar3.m_size = sVar2;
  SVar3.m_data = &this->m_valid;
  return SVar3;
}

Assistant:

String toString() const
    {
        if (!isValid()) {
            return "n/a";
        }

        char *buf = new char[8]();
        snprintf(buf, 8, "%02hhx:%02hhx.%01hhx", bus(), device(), function());

        return buf;
    }